

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::SerializerTest_shouldRestoreStreamState_Test::TestBody
          (SerializerTest_shouldRestoreStreamState_Test *this)

{
  undefined8 *puVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  char_type saved_fill;
  locale saved_locale;
  fmtflags saved_flags;
  streamsize saved_width;
  streamsize saved_precision;
  ostringstream os;
  undefined1 auStack_1d8 [8];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1d0;
  AssertHelper local_1c8;
  char local_1b9;
  internal local_1b8 [8];
  undefined8 *local_1b0;
  locale local_1a8 [12];
  _Ios_Fmtflags local_19c;
  long local_198;
  long local_190;
  long local_188;
  long alStack_180 [2];
  _Ios_Fmtflags a_Stack_170 [22];
  ios_base local_118 [96];
  locale alStack_b8 [16];
  char acStack_a8 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
  lVar3 = *(long *)(local_188 + -0x18);
  local_19c = *(_Ios_Fmtflags *)((long)a_Stack_170 + lVar3);
  local_190 = *(long *)((long)alStack_180 + lVar3);
  local_198 = *(long *)((long)alStack_180 + lVar3 + 8);
  if (acStack_a8[lVar3 + 1] == '\x01') {
    local_1b9 = acStack_a8[lVar3];
  }
  else {
    local_1b9 = std::ios::widen((char)auStack_1d8 + (char)lVar3 + 'P');
    acStack_a8[lVar3] = local_1b9;
    acStack_a8[lVar3 + 1] = '\x01';
    lVar3 = *(long *)(local_188 + -0x18);
  }
  std::locale::locale(local_1a8,alStack_b8 + lVar3);
  TextSerializer::Serialize
            (&(this->super_SerializerTest).textSerializer,(ostream *)&local_188,
             &(this->super_SerializerTest).collected);
  local_1d0._M_head_impl._0_4_ = *(undefined4 *)((long)a_Stack_170 + *(long *)(local_188 + -0x18));
  testing::internal::CmpHelperEQ<std::_Ios_Fmtflags,std::_Ios_Fmtflags>
            (local_1b8,"os.flags()","saved_flags",(_Ios_Fmtflags *)&local_1d0,&local_19c);
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if (local_1b0 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_1b0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/serializer_test.cc"
               ,0x44,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  puVar1 = local_1b0;
  if (local_1b0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1b0 != local_1b0 + 2) {
      operator_delete((undefined8 *)*local_1b0);
    }
    operator_delete(puVar1);
  }
  local_1d0._M_head_impl =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        ((long)alStack_180 + *(long *)(local_188 + -0x18));
  testing::internal::CmpHelperEQ<long,long>
            (local_1b8,"os.precision()","saved_precision",(long *)&local_1d0,&local_190);
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if (local_1b0 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_1b0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/serializer_test.cc"
               ,0x45,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  puVar1 = local_1b0;
  if (local_1b0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1b0 != local_1b0 + 2) {
      operator_delete((undefined8 *)*local_1b0);
    }
    operator_delete(puVar1);
  }
  local_1d0._M_head_impl =
       *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        ((long)alStack_180 + *(long *)(local_188 + -0x18) + 8);
  testing::internal::CmpHelperEQ<long,long>
            (local_1b8,"os.width()","saved_width",(long *)&local_1d0,&local_198);
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if (local_1b0 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_1b0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/serializer_test.cc"
               ,0x46,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  puVar1 = local_1b0;
  if (local_1b0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1b0 != local_1b0 + 2) {
      operator_delete((undefined8 *)*local_1b0);
    }
    operator_delete(puVar1);
  }
  lVar3 = *(long *)(local_188 + -0x18);
  if (acStack_a8[lVar3 + 1] == '\x01') {
    cVar2 = acStack_a8[lVar3];
  }
  else {
    cVar2 = std::ios::widen((char)auStack_1d8 + (char)lVar3 + 'P');
    acStack_a8[lVar3] = cVar2;
    acStack_a8[lVar3 + 1] = '\x01';
  }
  local_1d0._M_head_impl._0_1_ = cVar2;
  testing::internal::CmpHelperEQ<char,char>
            (local_1b8,"os.fill()","saved_fill",(char *)&local_1d0,&local_1b9);
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if (local_1b0 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_1b0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/serializer_test.cc"
               ,0x47,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  puVar1 = local_1b0;
  if (local_1b0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1b0 != local_1b0 + 2) {
      operator_delete((undefined8 *)*local_1b0);
    }
    operator_delete(puVar1);
  }
  std::locale::locale((locale *)&local_1d0,alStack_b8 + *(long *)(local_188 + -0x18));
  testing::internal::CmpHelperEQ<std::locale,std::locale>
            (local_1b8,"os.getloc()","saved_locale",(locale *)&local_1d0,local_1a8);
  std::locale::~locale((locale *)&local_1d0);
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    if (local_1b0 == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (char *)*local_1b0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/serializer_test.cc"
               ,0x48,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (local_1d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d0._M_head_impl + 8))();
    }
  }
  if (local_1b0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1b0 != local_1b0 + 2) {
      operator_delete((undefined8 *)*local_1b0);
    }
    operator_delete(local_1b0);
  }
  std::locale::~locale(local_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

TEST_F(SerializerTest, shouldRestoreStreamState) {
  std::ostringstream os;

  // save stream state
  auto saved_flags = os.flags();
  auto saved_precision = os.precision();
  auto saved_width = os.width();
  auto saved_fill = os.fill();
  auto saved_locale = os.getloc();

  // serialize
  textSerializer.Serialize(os, collected);

  // check for expected flags
  EXPECT_EQ(os.flags(), saved_flags);
  EXPECT_EQ(os.precision(), saved_precision);
  EXPECT_EQ(os.width(), saved_width);
  EXPECT_EQ(os.fill(), saved_fill);
  EXPECT_EQ(os.getloc(), saved_locale);
}